

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t pax_attribute(archive_read *a,tar *tar,archive_entry *entry,char *key,size_t key_length,
                     size_t value_length,int64_t *unconsumed)

{
  byte bVar1;
  undefined4 uVar2;
  long remaining;
  long offset;
  long lVar3;
  wchar_t wVar4;
  long *plVar5;
  archive_entry *entry_00;
  void *value;
  int *piVar6;
  ulong uVar7;
  char *pcVar8;
  wchar_t wVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long n;
  uint local_40;
  undefined4 uStack_3c;
  long local_38;
  
  bVar1 = *key;
  if (bVar1 < 0x53) {
    if (bVar1 == 0x47) {
      if ((key_length < 5) || (*(int *)key != 0x2e554e47)) goto switchD_0013785e_caseD_62;
      if (key_length - 4 == 6) {
        if (*(short *)(key + 8) == 0x6573 && *(int *)(key + 4) == 0x72617073) {
          tar->sparse_gnu_attributes_seen = '\x01';
        }
        goto switchD_0013785e_caseD_62;
      }
      if ((key_length - 4 < 8) ||
         (*(int *)(key + 7) != 0x2e657372 || *(int *)(key + 4) != 0x72617073))
      goto switchD_0013785e_caseD_62;
      tar->sparse_gnu_attributes_seen = '\x01';
      switch(key_length) {
      case 0xe:
        if (key[0xd] != 'p' || *(short *)(key + 0xb) != 0x616d) break;
        tar->sparse_gnu_major = 0;
        tar->sparse_gnu_minor = 1;
        if (value_length < 0x800001) {
          pcVar8 = (char *)__archive_read_ahead(a,value_length,(ssize_t *)&local_40);
          if (pcVar8 == (char *)0x0) {
            pcVar8 = "Truncated archive detected while reading GNU sparse data";
            goto LAB_00138610;
          }
          wVar4 = gnu_sparse_01_parse(a,tar,pcVar8,value_length);
          goto LAB_0013832e;
        }
        goto LAB_00137f4b;
      case 0xf:
        if (*(int *)(key + 0xb) == 0x657a6973) {
          wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
          if (wVar4 == L'\0') {
            tar->GNU_sparse_size = CONCAT44(uStack_3c,local_40);
            tar->size_fields = tar->size_fields | 4;
            return L'\0';
          }
          return wVar4;
        }
        if (*(int *)(key + 0xb) == 0x656d616e) {
          if (value_length < 0x100001) {
            tar = (tar *)&tar->entry_pathname_override;
            goto LAB_0013807b;
          }
          goto LAB_00137e05;
        }
        break;
      case 0x10:
        if (key[0xf] == 'r' && *(int *)(key + 0xb) == 0x6f6a616d) {
          wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
          if (CONCAT44(uStack_3c,local_40) < 0xb && wVar4 == L'\0') {
            tar->sparse_gnu_major = local_40;
            return L'\0';
          }
          return wVar4;
        }
        if (key[0xf] == 'r' && *(int *)(key + 0xb) == 0x6f6e696d) {
          wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
          if (CONCAT44(uStack_3c,local_40) < 0xb && wVar4 == L'\0') {
            tar->sparse_gnu_minor = local_40;
            return L'\0';
          }
          return wVar4;
        }
        break;
      case 0x11:
        if (*(short *)(key + 0xf) == 0x7465 && *(int *)(key + 0xb) == 0x7366666f) {
          wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
          if (wVar4 != L'\0') {
            return wVar4;
          }
          offset = CONCAT44(uStack_3c,local_40);
          tar->sparse_offset = offset;
          remaining = tar->sparse_numbytes;
          lVar3 = remaining;
joined_r0x001386d0:
          if (lVar3 == -1) {
            return L'\0';
          }
          wVar4 = gnu_add_sparse_entry(a,tar,offset,remaining);
          if (wVar4 == L'\0') {
            *(undefined4 *)&tar->sparse_offset = 0xffffffff;
            *(undefined4 *)((long)&tar->sparse_offset + 4) = 0xffffffff;
            *(undefined4 *)&tar->sparse_numbytes = 0xffffffff;
            *(undefined4 *)((long)&tar->sparse_numbytes + 4) = 0xffffffff;
            return L'\0';
          }
          return L'\xffffffe2';
        }
        break;
      case 0x13:
        if (*(long *)(key + 0xb) == 0x73657479626d756e) {
          wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
          if (wVar4 != L'\0') {
            return wVar4;
          }
          remaining = CONCAT44(uStack_3c,local_40);
          tar->sparse_numbytes = remaining;
          offset = tar->sparse_offset;
          lVar3 = offset;
          goto joined_r0x001386d0;
        }
        if (*(long *)(key + 0xb) == 0x657a69736c616572) {
          wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
          if (wVar4 == L'\0') {
            tar->GNU_sparse_realsize = CONCAT44(uStack_3c,local_40);
            tar->size_fields = tar->size_fields | 2;
            return L'\0';
          }
          return wVar4;
        }
        break;
      case 0x14:
        if (key[0x13] == 's' && *(long *)(key + 0xb) == 0x6b636f6c626d756e) {
          *(undefined4 *)&tar->sparse_offset = 0xffffffff;
          *(undefined4 *)((long)&tar->sparse_offset + 4) = 0xffffffff;
          *(undefined4 *)&tar->sparse_numbytes = 0xffffffff;
          *(undefined4 *)((long)&tar->sparse_numbytes + 4) = 0xffffffff;
          tar->sparse_gnu_major = 0;
          tar->sparse_gnu_minor = 0;
        }
      }
      goto switchD_0013785e_caseD_62;
    }
    if (bVar1 != 0x4c) {
      if ((bVar1 != 0x52) || (key_length != 0x14)) goto switchD_0013785e_caseD_62;
      uVar2 = *(undefined4 *)(key + 0x10);
      auVar13[0] = -((char)uVar2 == 'i');
      auVar13[1] = -((char)((uint)uVar2 >> 8) == 'n');
      auVar13[2] = -((char)((uint)uVar2 >> 0x10) == 'u');
      auVar13[3] = -((char)((uint)uVar2 >> 0x18) == 'x');
      auVar13[4] = 0xff;
      auVar13[5] = 0xff;
      auVar13[6] = 0xff;
      auVar13[7] = 0xff;
      auVar13[8] = 0xff;
      auVar13[9] = 0xff;
      auVar13[10] = 0xff;
      auVar13[0xb] = 0xff;
      auVar13[0xc] = 0xff;
      auVar13[0xd] = 0xff;
      auVar13[0xe] = 0xff;
      auVar13[0xf] = 0xff;
      auVar11[0] = -(*key == 'R');
      auVar11[1] = -(key[1] == 'H');
      auVar11[2] = -(key[2] == 'T');
      auVar11[3] = -(key[3] == '.');
      auVar11[4] = -(key[4] == 's');
      auVar11[5] = -(key[5] == 'e');
      auVar11[6] = -(key[6] == 'c');
      auVar11[7] = -(key[7] == 'u');
      auVar11[8] = -(key[8] == 'r');
      auVar11[9] = -(key[9] == 'i');
      auVar11[10] = -(key[10] == 't');
      auVar11[0xb] = -(key[0xb] == 'y');
      auVar11[0xc] = -(key[0xc] == '.');
      auVar11[0xd] = -(key[0xd] == 's');
      auVar11[0xe] = -(key[0xe] == 'e');
      auVar11[0xf] = -(key[0xf] == 'l');
      auVar11 = auVar11 & auVar13;
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff)
      goto switchD_0013785e_caseD_62;
      if (value_length < 0x1000001) {
        value = __archive_read_ahead(a,value_length,(ssize_t *)&local_40);
        if (value != (void *)0x0) {
          archive_entry_xattr_add_entry(entry,"security.selinux",value,value_length);
          goto LAB_00137ec2;
        }
        pcVar8 = "Truncated archive detected while reading selinux data";
        goto LAB_00138610;
      }
      pcVar8 = "Ignoring unreasonably large security.selinux attribute: %d > %d";
      goto LAB_0013791b;
    }
    if ((key_length < 0xc) ||
       (*(long *)(key + 3) != 0x2e45564948435241 || *(long *)key != 0x494843524142494c))
    goto switchD_0013785e_caseD_62;
    if (key_length == 0x16) {
      if (*(long *)(key + 0xe) == 0x657079746b6e696c && *(long *)(key + 0xb) == 0x746b6e696c6d7973)
      {
        if (0xf < value_length) {
          pcVar8 = "symlink type is very long(longest recognized value is 4 bytes, this is %d)";
          iVar10 = -1;
          goto LAB_00137f80;
        }
        piVar6 = (int *)__archive_read_ahead(a,value_length,(ssize_t *)&local_40);
        if (piVar6 == (int *)0x0) {
          pcVar8 = "Truncated tar archive detected while reading `symlinktype` attribute";
          goto LAB_001380f9;
        }
        if (value_length == 3) {
          if (*(char *)((long)piVar6 + 2) != 'r' || (short)*piVar6 != 0x6964) goto LAB_001385ba;
          wVar4 = L'\x02';
        }
        else {
          if ((value_length != 4) || (*piVar6 != 0x656c6966)) {
LAB_001385ba:
            archive_set_error(&a->archive,-1,"Unrecognized symlink type");
            goto LAB_00137f8a;
          }
          wVar4 = L'\x01';
        }
        archive_entry_set_symlink_type(entry,wVar4);
        goto LAB_00137ec2;
      }
    }
    else if (key_length == 0x17) {
      if (*(int *)(key + 0x13) == 0x656d6974 && *(long *)(key + 0xb) == 0x6e6f697461657263) {
        wVar4 = pax_attribute_read_time(a,value_length,(int64_t *)&local_40,&local_38,unconsumed);
        if (wVar4 == L'\0') {
          archive_entry_set_birthtime(entry,CONCAT44(uStack_3c,local_40),local_38);
          return L'\0';
        }
        return wVar4;
      }
    }
    else if (0xfffffffffffffff8 < key_length - 0x12) goto switchD_0013785e_caseD_62;
    if (*(short *)(key + 0xf) != 0x2e72 || *(int *)(key + 0xb) != 0x74746178)
    goto switchD_0013785e_caseD_62;
    wVar9 = L'\xffffffec';
    if (0x1000000 < value_length) goto LAB_00137f8f;
    pcVar8 = (char *)__archive_read_ahead(a,value_length,(ssize_t *)&local_40);
    if (pcVar8 != (char *)0x0) {
      wVar4 = pax_attribute_LIBARCHIVE_xattr(entry,key + 0x11,key_length - 0x11,pcVar8,value_length)
      ;
      goto LAB_0013832e;
    }
    pcVar8 = "Truncated archive detected while reading xattr information";
    goto LAB_00138610;
  }
  switch(bVar1) {
  case 0x61:
    if ((key_length == 5) && (key[4] == 'e' && *(int *)key == 0x6d697461)) {
      wVar4 = pax_attribute_read_time(a,value_length,(int64_t *)&local_40,&local_38,unconsumed);
      if (wVar4 == L'\0') {
        archive_entry_set_atime(entry,CONCAT44(uStack_3c,local_40),local_38);
        return L'\0';
      }
      return wVar4;
    }
    break;
  case 0x62:
  case 100:
  case 0x65:
  case 0x66:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x74:
    break;
  case 99:
    if ((key_length == 5) && (key[4] == 'e' && *(int *)key == 0x6d697463)) {
      wVar4 = pax_attribute_read_time(a,value_length,(int64_t *)&local_40,&local_38,unconsumed);
      if (wVar4 == L'\0') {
        archive_entry_set_ctime(entry,CONCAT44(uStack_3c,local_40),local_38);
        return L'\0';
      }
      return wVar4;
    }
    break;
  case 0x67:
    if (key_length == 5) {
      if (key[4] == 'e' && *(int *)key == 0x6d616e67) {
        if (value_length < 0x10001) {
          tar = (tar *)&tar->entry_gname;
          goto LAB_0013807b;
        }
        goto LAB_00137e05;
      }
    }
    else if ((key_length == 3) && (key[2] == 'd' && *(short *)key == 0x6967)) {
      wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
      if (wVar4 == L'\0') {
        archive_entry_set_gid(entry,CONCAT44(uStack_3c,local_40));
        return L'\0';
      }
      return wVar4;
    }
    break;
  case 0x68:
    if ((key_length != 10) || (*(short *)(key + 8) != 0x7465 || *(long *)key != 0x7372616863726468))
    break;
    if (value_length < 0x40) {
      piVar6 = (int *)__archive_read_ahead(a,value_length,(ssize_t *)&local_40);
      if (piVar6 == (int *)0x0) {
        pcVar8 = "Truncated tar archive detected while reading hdrcharset attribute";
LAB_001380f9:
        iVar10 = 0x54;
        goto LAB_00138618;
      }
      wVar9 = L'\xffffffec';
      if (value_length == 0x17) {
        auVar14[0] = -(*(char *)((long)piVar6 + 7) == '1');
        auVar14[1] = -((char)piVar6[2] == '0');
        auVar14[2] = -(*(char *)((long)piVar6 + 9) == '6');
        auVar14[3] = -(*(char *)((long)piVar6 + 10) == '4');
        auVar14[4] = -(*(char *)((long)piVar6 + 0xb) == '6');
        auVar14[5] = -((char)piVar6[3] == ' ');
        auVar14[6] = -(*(char *)((long)piVar6 + 0xd) == '2');
        auVar14[7] = -(*(char *)((long)piVar6 + 0xe) == '0');
        auVar14[8] = -(*(char *)((long)piVar6 + 0xf) == '0');
        auVar14[9] = -((char)piVar6[4] == '0');
        auVar14[10] = -(*(char *)((long)piVar6 + 0x11) == ' ');
        auVar14[0xb] = -(*(char *)((long)piVar6 + 0x12) == 'U');
        auVar14[0xc] = -(*(char *)((long)piVar6 + 0x13) == 'T');
        auVar14[0xd] = -((char)piVar6[5] == 'F');
        auVar14[0xe] = -(*(char *)((long)piVar6 + 0x15) == '-');
        auVar14[0xf] = -(*(char *)((long)piVar6 + 0x16) == '8');
        auVar12[0] = -((char)*piVar6 == 'I');
        auVar12[1] = -(*(char *)((long)piVar6 + 1) == 'S');
        auVar12[2] = -(*(char *)((long)piVar6 + 2) == 'O');
        auVar12[3] = -(*(char *)((long)piVar6 + 3) == '-');
        auVar12[4] = -((char)piVar6[1] == 'I');
        auVar12[5] = -(*(char *)((long)piVar6 + 5) == 'R');
        auVar12[6] = -(*(char *)((long)piVar6 + 6) == ' ');
        auVar12[7] = -(*(char *)((long)piVar6 + 7) == '1');
        auVar12[8] = -((char)piVar6[2] == '0');
        auVar12[9] = -(*(char *)((long)piVar6 + 9) == '6');
        auVar12[10] = -(*(char *)((long)piVar6 + 10) == '4');
        auVar12[0xb] = -(*(char *)((long)piVar6 + 0xb) == '6');
        auVar12[0xc] = -((char)piVar6[3] == ' ');
        auVar12[0xd] = -(*(char *)((long)piVar6 + 0xd) == '2');
        auVar12[0xe] = -(*(char *)((long)piVar6 + 0xe) == '0');
        auVar12[0xf] = -(*(char *)((long)piVar6 + 0xf) == '0');
        auVar12 = auVar12 & auVar14;
        if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00137f8f;
        tar->pax_hdrcharset_utf8 = 1;
      }
      else {
        if ((value_length != 6) || ((short)piVar6[1] != 0x5952 || *piVar6 != 0x414e4942))
        goto LAB_00137f8f;
        tar->pax_hdrcharset_utf8 = 0;
      }
LAB_00137ec2:
      wVar9 = L'\0';
      goto LAB_00137f8f;
    }
    pcVar8 = "hdrcharset attribute is unreasonably large (%d bytes)";
    iVar10 = 0x54;
LAB_00137f80:
    archive_set_error(&a->archive,iVar10,pcVar8,value_length & 0xffffffff);
    goto LAB_00137f8a;
  case 0x6c:
    if ((key_length == 8) && (*(long *)key == 0x687461706b6e696c)) {
      if (value_length < 0x100001) {
        tar = (tar *)&tar->entry_linkpath;
LAB_0013807b:
        wVar4 = read_bytes_to_string(a,&tar->entry_pathname,value_length,unconsumed);
        return wVar4;
      }
LAB_00137e05:
      *unconsumed = *unconsumed + value_length;
      return L'\xffffffec';
    }
    break;
  case 0x6d:
    if ((key_length == 5) && (key[4] == 'e' && *(int *)key == 0x6d69746d)) {
      wVar4 = pax_attribute_read_time(a,value_length,(int64_t *)&local_40,&local_38,unconsumed);
      if (wVar4 == L'\0') {
        archive_entry_set_mtime(entry,CONCAT44(uStack_3c,local_40),local_38);
        return L'\0';
      }
      return wVar4;
    }
    break;
  case 0x70:
    if ((key_length == 4) && (*(int *)key == 0x68746170)) {
      if (value_length < 0x100001) goto LAB_0013807b;
      goto LAB_00137e05;
    }
    break;
  case 0x73:
    if ((key_length != 4) || (*(int *)key != 0x657a6973)) break;
    wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
    if (wVar4 == L'\0') {
      tar->pax_size = CONCAT44(uStack_3c,local_40);
      tar->size_fields = tar->size_fields | 1;
      return L'\0';
    }
    if (CONCAT44(uStack_3c,local_40) != 0x7fffffffffffffff) {
      return wVar4;
    }
    tar->entry_bytes_remaining = 0;
    pcVar8 = "Tar size attribute overflow";
    iVar10 = -1;
    goto LAB_00138618;
  case 0x75:
    if (key_length == 5) {
      if (key[4] == 'e' && *(int *)key == 0x6d616e75) {
        if (value_length < 0x10001) {
          tar = (tar *)&tar->entry_uname;
          goto LAB_0013807b;
        }
        goto LAB_00137e05;
      }
    }
    else if ((key_length == 3) && (key[2] == 'd' && *(short *)key == 0x6975)) {
      wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
      if (wVar4 == L'\0') {
        archive_entry_set_uid(entry,CONCAT44(uStack_3c,local_40));
        return L'\0';
      }
      return wVar4;
    }
    break;
  default:
    if (bVar1 != 0x53) break;
    plVar5 = (long *)key;
    uVar7 = key_length;
    if (key_length < 8) {
LAB_00137d08:
      if (uVar7 < 5) break;
      goto LAB_00137d12;
    }
    if (*(int *)(key + 3) != 0x2e594c49 || *(int *)key != 0x49484353) goto LAB_00137d12;
    uVar7 = key_length - 7;
    plVar5 = (long *)(key + 7);
    switch(key_length) {
    case 10:
      if (key[9] == 'v' && (short)*plVar5 == 0x6564) {
        wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
        if (wVar4 == L'\0') {
          archive_entry_set_dev(entry,CONCAT44(uStack_3c,local_40));
          return L'\0';
        }
        return wVar4;
      }
      if (key[9] == 'o' && (short)*plVar5 == 0x6e69) {
        wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
        if (wVar4 == L'\0') {
          archive_entry_set_ino(entry,CONCAT44(uStack_3c,local_40));
          return L'\0';
        }
        return wVar4;
      }
      goto switchD_0013785e_caseD_62;
    default:
      if (uVar7 < 7) goto LAB_00137d08;
      break;
    case 0xc:
      uVar7 = 5;
      if (key[0xb] == 'k' && (int)*plVar5 == 0x6e696c6e) {
        wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
        if (wVar4 == L'\0') {
          archive_entry_set_nlink(entry,local_40);
          return L'\0';
        }
        return wVar4;
      }
      goto LAB_00137d12;
    case 0xd:
      uVar7 = 6;
      if (*(short *)(key + 0xb) == 0x7367 && (int)*plVar5 == 0x616c6666) {
        wVar9 = L'\xffffffec';
        if (0x1ff < value_length) goto LAB_00137f8f;
        pcVar8 = (char *)__archive_read_ahead(a,value_length,(ssize_t *)&local_40);
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "Truncated archive detected while reading SCHILY.fflags";
          goto LAB_00138610;
        }
        archive_entry_copy_fflags_text_len(entry,pcVar8,value_length);
        goto LAB_00137ec2;
      }
      goto LAB_00137d12;
    case 0xe:
      if (*(int *)(key + 10) == 0x6563612e && (int)*plVar5 == 0x2e6c6361) {
        wVar4 = L'㰀';
LAB_0013828b:
        wVar4 = pax_attribute_SCHILY_acl(a,tar,entry,value_length,wVar4);
        return wVar4;
      }
      break;
    case 0xf:
      if (*plVar5 == 0x726f6a616d766564) {
        wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
        if (wVar4 == L'\0') {
          archive_entry_set_rdevmajor(entry,CONCAT44(uStack_3c,local_40));
          return L'\0';
        }
        return wVar4;
      }
      if (*plVar5 == 0x726f6e696d766564) {
        wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
        if (wVar4 == L'\0') {
          archive_entry_set_rdevminor(entry,CONCAT44(uStack_3c,local_40));
          return L'\0';
        }
        return wVar4;
      }
      if (*plVar5 == 0x657a69736c616572) {
        wVar4 = pax_attribute_read_number(a,value_length,(int64_t *)&local_40);
        if (wVar4 == L'\0') {
          tar->SCHILY_sparse_realsize = CONCAT44(uStack_3c,local_40);
          tar->size_fields = tar->size_fields | 8;
          return L'\0';
        }
        return wVar4;
      }
      break;
    case 0x11:
      if (*(short *)(key + 0xf) == 0x7373 && *plVar5 == 0x656363612e6c6361) {
        wVar4 = L'Ā';
        goto LAB_0013828b;
      }
      break;
    case 0x12:
      if (*(long *)(key + 10) == 0x746c75616665642e && *plVar5 == 0x616665642e6c6361) {
        wVar4 = L'Ȁ';
        goto LAB_0013828b;
      }
    }
    if (*(short *)(key + 0xb) == 0x2e72 && (int)*plVar5 == 0x74746178) {
      if (0xffffff < value_length) {
        pcVar8 = "Unreasonably large xattr: %d > %d";
LAB_0013791b:
        archive_set_error(&a->archive,-1,pcVar8,value_length & 0xffffffff,0x1000000);
LAB_00137f8a:
        wVar9 = L'\xffffffec';
LAB_00137f8f:
        __archive_read_consume(a,value_length);
        return wVar9;
      }
      pcVar8 = (char *)__archive_read_ahead(a,value_length,(ssize_t *)&local_40);
      if (pcVar8 != (char *)0x0) {
        wVar4 = pax_attribute_SCHILY_xattr(entry,key + 0xd,key_length - 0xd,pcVar8,value_length);
LAB_0013832e:
        wVar9 = L'\xffffffec';
        if (wVar4 == L'\0') {
          wVar9 = L'\0';
        }
        goto LAB_00137f8f;
      }
      pcVar8 = "Truncated archive detected while reading SCHILY.xattr";
    }
    else {
LAB_00137d12:
      if (((uVar7 != 0xd) || ((int)*plVar5 != 0x2e4e5553)) ||
         (*(char *)((long)plVar5 + 0xc) != 'a' || *(long *)((long)plVar5 + 4) != 0x74616473656c6f68)
         ) break;
      if (0x7fffff < value_length) {
LAB_00137f4b:
        archive_set_error(&a->archive,-1,"Unreasonably large sparse map: %d > %d",
                          value_length & 0xffffffff,0x800000);
        wVar9 = L'\xffffffe7';
        goto LAB_00137f8f;
      }
      entry_00 = (archive_entry *)__archive_read_ahead(a,value_length,(ssize_t *)&local_40);
      if (entry_00 != (archive_entry *)0x0) {
        wVar4 = pax_attribute_SUN_holesdata(a,tar,entry_00,(char *)value_length,(size_t)unconsumed);
        wVar9 = L'\0';
        if (wVar4 < L'\0') {
          archive_set_error(&a->archive,-1,"Parse error: SUN.holesdata");
          wVar9 = wVar4;
        }
        goto LAB_00137f8f;
      }
      pcVar8 = "Truncated archive detected while reading SUN.holesdata";
    }
LAB_00138610:
    iVar10 = 0x16;
LAB_00138618:
    archive_set_error(&a->archive,iVar10,pcVar8);
    return L'\xffffffe2';
  }
switchD_0013785e_caseD_62:
  __archive_read_consume(a,value_length);
  return L'\0';
}

Assistant:

static int
pax_attribute(struct archive_read *a, struct tar *tar, struct archive_entry *entry,
	      const char *key, size_t key_length, size_t value_length, int64_t *unconsumed)
{
	int64_t t;
	long n;
	const char *p;
	ssize_t bytes_read;
	int err = ARCHIVE_OK;

	switch (key[0]) {
	case 'G':
		/* GNU.* extensions */
		if (key_length > 4 && memcmp(key, "GNU.", 4) == 0) {
			key += 4;
			key_length -= 4;

			/* GNU.sparse marks the existence of GNU sparse information */
			if (key_length == 6 && memcmp(key, "sparse", 6) == 0) {
				tar->sparse_gnu_attributes_seen = 1;
			}

			/* GNU.sparse.* extensions */
			else if (key_length > 7 && memcmp(key, "sparse.", 7) == 0) {
				tar->sparse_gnu_attributes_seen = 1;
				key += 7;
				key_length -= 7;

				/* GNU "0.0" sparse pax format. */
				if (key_length == 9 && memcmp(key, "numblocks", 9) == 0) {
					/* GNU.sparse.numblocks */
					tar->sparse_offset = -1;
					tar->sparse_numbytes = -1;
					tar->sparse_gnu_major = 0;
					tar->sparse_gnu_minor = 0;
				}
				else if (key_length == 6 && memcmp(key, "offset", 6) == 0) {
					/* GNU.sparse.offset */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
						tar->sparse_offset = t;
						if (tar->sparse_numbytes != -1) {
							if (gnu_add_sparse_entry(a, tar,
									 tar->sparse_offset, tar->sparse_numbytes)
							    != ARCHIVE_OK)
								return (ARCHIVE_FATAL);
							tar->sparse_offset = -1;
							tar->sparse_numbytes = -1;
						}
					}
					return (err);
				}
				else if (key_length == 8 && memcmp(key, "numbytes", 8) == 0) {
					/* GNU.sparse.numbytes */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
						tar->sparse_numbytes = t;
						if (tar->sparse_offset != -1) {
							if (gnu_add_sparse_entry(a, tar,
									 tar->sparse_offset, tar->sparse_numbytes)
							    != ARCHIVE_OK)
								return (ARCHIVE_FATAL);
							tar->sparse_offset = -1;
							tar->sparse_numbytes = -1;
						}
					}
					return (err);
				}
				else if (key_length == 4 && memcmp(key, "size", 4) == 0) {
					/* GNU.sparse.size */
					/* This is either the size of stored entry OR the size of data on disk,
					 * depending on which GNU sparse format version is in use.
					 * Since pax attributes can be in any order, we may not actually
					 * know at this point how to interpret this. */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
						tar->GNU_sparse_size = t;
						tar->size_fields |= TAR_SIZE_GNU_SPARSE_SIZE;
					}
					return (err);
				}

				/* GNU "0.1" sparse pax format. */
				else if (key_length == 3 && memcmp(key, "map", 3) == 0) {
					/* GNU.sparse.map */
					tar->sparse_gnu_major = 0;
					tar->sparse_gnu_minor = 1;
					if (value_length > sparse_map_limit) {
						archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
								  "Unreasonably large sparse map: %d > %d",
								  (int)value_length, (int)sparse_map_limit);
						err = ARCHIVE_FAILED;
					} else {
						p = __archive_read_ahead(a, value_length, &bytes_read);
						if (p == NULL) {
							archive_set_error(&a->archive, EINVAL,
									  "Truncated archive"
									  " detected while reading GNU sparse data");
							return (ARCHIVE_FATAL);
						}
						if (gnu_sparse_01_parse(a, tar, p, value_length) != ARCHIVE_OK) {
							err = ARCHIVE_WARN;
						}
					}
					__archive_read_consume(a, value_length);
					return (err);
				}

				/* GNU "1.0" sparse pax format */
				else if (key_length == 5 && memcmp(key, "major", 5) == 0) {
					/* GNU.sparse.major */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK
					    && t >= 0
					    && t <= 10) {
						tar->sparse_gnu_major = (int)t;
					}
					return (err);
				}
				else if (key_length == 5 && memcmp(key, "minor", 5) == 0) {
					/* GNU.sparse.minor */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK
					    && t >= 0
					    && t <= 10) {
						tar->sparse_gnu_minor = (int)t;
					}
					return (err);
				}
				else if (key_length == 4 && memcmp(key, "name", 4) == 0) {
					/* GNU.sparse.name */
					/*
					 * The real filename; when storing sparse
					 * files, GNU tar puts a synthesized name into
					 * the regular 'path' attribute in an attempt
					 * to limit confusion. ;-)
					 */
					if (value_length > pathname_limit) {
						*unconsumed += value_length;
						err = ARCHIVE_WARN;
					} else {
						err = read_bytes_to_string(a, &(tar->entry_pathname_override),
									   value_length, unconsumed);
					}
					return (err);
				}
				else if (key_length == 8 && memcmp(key, "realsize", 8) == 0) {
					/* GNU.sparse.realsize = size of file on disk */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
						tar->GNU_sparse_realsize = t;
						tar->size_fields |= TAR_SIZE_GNU_SPARSE_REALSIZE;
					}
					return (err);
				}
			}
		}
		break;
	case 'L':
		/* LIBARCHIVE extensions */
		if (key_length > 11 && memcmp(key, "LIBARCHIVE.", 11) == 0) {
			key_length -= 11;
			key += 11;

			/* TODO: Handle arbitrary extended attributes... */
			/*
			  if (strcmp(key, "LIBARCHIVE.xxxxxxx") == 0)
				  archive_entry_set_xxxxxx(entry, value);
			*/
			if (key_length == 12 && memcmp(key, "creationtime", 12) == 0) {
				/* LIBARCHIVE.creationtime */
				if ((err = pax_attribute_read_time(a, value_length, &t, &n, unconsumed)) == ARCHIVE_OK) {
					archive_entry_set_birthtime(entry, t, n);
				}
				return (err);
			}
			else if (key_length == 11 && memcmp(key, "symlinktype", 11) == 0) {
				/* LIBARCHIVE.symlinktype */
				if (value_length < 16) {
					p = __archive_read_ahead(a, value_length, &bytes_read);
					if (p == NULL) {
						archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
								  "Truncated tar archive "
								  "detected while reading `symlinktype` attribute");
						return (ARCHIVE_FATAL);
					}
					if (value_length == 4 && memcmp(p, "file", 4) == 0) {
						archive_entry_set_symlink_type(entry,
									       AE_SYMLINK_TYPE_FILE);
					} else if (value_length == 3 && memcmp(p, "dir", 3) == 0) {
							archive_entry_set_symlink_type(entry,
										       AE_SYMLINK_TYPE_DIRECTORY);
					} else {
						archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
								  "Unrecognized symlink type");
						err = ARCHIVE_WARN;
					}
				} else {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
							  "symlink type is very long"
							  "(longest recognized value is 4 bytes, this is %d)",
							  (int)value_length);
					err = ARCHIVE_WARN;
				}
				__archive_read_consume(a, value_length);
				return (err);
			}
			else if (key_length > 6 && memcmp(key, "xattr.", 6) == 0) {
				key_length -= 6;
				key += 6;
				if (value_length > xattr_limit) {
					err = ARCHIVE_WARN;
				} else {
					p = __archive_read_ahead(a, value_length, &bytes_read);
					if (p == NULL) {
						archive_set_error(&a->archive, EINVAL,
								  "Truncated archive"
								  " detected while reading xattr information");
						return (ARCHIVE_FATAL);
					}
					if (pax_attribute_LIBARCHIVE_xattr(entry, key, key_length, p, value_length)) {
						/* TODO: Unable to parse xattr */
						err = ARCHIVE_WARN;
					}
				}
				__archive_read_consume(a, value_length);
				return (err);
			}
		}
		break;
	case 'R':
		/* GNU tar uses RHT.security header to store SELinux xattrs
		 * SCHILY.xattr.security.selinux == RHT.security.selinux */
		if (key_length == 20 && memcmp(key, "RHT.security.selinux", 20) == 0) {
			if (value_length > xattr_limit) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring unreasonably large security.selinux attribute:"
						  " %d > %d",
						  (int)value_length, (int)xattr_limit);
				/* TODO: Should this be FAILED instead? */
				err = ARCHIVE_WARN;
			} else {
				p = __archive_read_ahead(a, value_length, &bytes_read);
				if (p == NULL) {
					archive_set_error(&a->archive, EINVAL,
							  "Truncated archive"
							  " detected while reading selinux data");
					return (ARCHIVE_FATAL);
				}
				if (pax_attribute_RHT_security_selinux(entry, p, value_length)) {
					/* TODO: Unable to parse xattr */
					err = ARCHIVE_WARN;
				}
			}
			__archive_read_consume(a, value_length);
			return (err);
		}
		break;
	case 'S':
		/* SCHILY.* extensions used by "star" archiver */
		if (key_length > 7 && memcmp(key, "SCHILY.", 7) == 0) {
			key_length -= 7;
			key += 7;

			if (key_length == 10 && memcmp(key, "acl.access", 10) == 0) {
				err = pax_attribute_SCHILY_acl(a, tar, entry, value_length,
						      ARCHIVE_ENTRY_ACL_TYPE_ACCESS);
				// TODO: Mark mode as set
				return (err);
			}
			else if (key_length == 11 && memcmp(key, "acl.default", 11) == 0) {
				err = pax_attribute_SCHILY_acl(a, tar, entry, value_length,
						      ARCHIVE_ENTRY_ACL_TYPE_DEFAULT);
				return (err);
			}
			else if (key_length == 7 && memcmp(key, "acl.ace", 7) == 0) {
				err = pax_attribute_SCHILY_acl(a, tar, entry, value_length,
						      ARCHIVE_ENTRY_ACL_TYPE_NFS4);
				// TODO: Mark mode as set
				return (err);
			}
			else if (key_length == 8 && memcmp(key, "devmajor", 8) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					archive_entry_set_rdevmajor(entry, (dev_t)t);
				}
				return (err);
			}
			else if (key_length == 8 && memcmp(key, "devminor", 8) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					archive_entry_set_rdevminor(entry, (dev_t)t);
				}
				return (err);
			}
			else if (key_length == 6 && memcmp(key, "fflags", 6) == 0) {
				if (value_length < fflags_limit) {
					p = __archive_read_ahead(a, value_length, &bytes_read);
					if (p == NULL) {
						/* Truncated archive */
						archive_set_error(&a->archive, EINVAL,
								  "Truncated archive"
								  " detected while reading SCHILY.fflags");
						return (ARCHIVE_FATAL);
					}
					archive_entry_copy_fflags_text_len(entry, p, value_length);
					err = ARCHIVE_OK;
				} else {
					/* Overlong fflags field */
					err = ARCHIVE_WARN;
				}
				__archive_read_consume(a, value_length);
				return (err);
			}
			else if (key_length == 3 && memcmp(key, "dev", 3) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					archive_entry_set_dev(entry, (dev_t)t);
				}
				return (err);
			}
			else if (key_length == 3 && memcmp(key, "ino", 3) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					archive_entry_set_ino(entry, t);
				}
				return (err);
			}
			else if (key_length == 5 && memcmp(key, "nlink", 5) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					archive_entry_set_nlink(entry, (unsigned int)t);
				}
				return (err);
			}
			else if (key_length == 8 && memcmp(key, "realsize", 8) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					tar->SCHILY_sparse_realsize = t;
					tar->size_fields |= TAR_SIZE_SCHILY_SPARSE_REALSIZE;
				}
				return (err);
			}
			/* TODO: Is there a SCHILY.sparse.size similar to GNU.sparse.size ? */
			else if (key_length > 6 && memcmp(key, "xattr.", 6) == 0) {
				key_length -= 6;
				key += 6;
				if (value_length < xattr_limit) {
					p = __archive_read_ahead(a, value_length, &bytes_read);
					if (p == NULL) {
						archive_set_error(&a->archive, EINVAL,
								  "Truncated archive"
								  " detected while reading SCHILY.xattr");
						return (ARCHIVE_FATAL);
					}
					if (pax_attribute_SCHILY_xattr(entry, key, key_length, p, value_length)) {
						/* TODO: Unable to parse xattr */
						err = ARCHIVE_WARN;
					}
				} else {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
							  "Unreasonably large xattr: %d > %d",
							  (int)value_length, (int)xattr_limit);
					err = ARCHIVE_WARN;
				}
				__archive_read_consume(a, value_length);
				return (err);
			}
		}
		/* SUN.* extensions from Solaris tar */
		if (key_length > 4 && memcmp(key, "SUN.", 4) == 0) {
			key_length -= 4;
			key += 4;

			if (key_length == 9 && memcmp(key, "holesdata", 9) == 0) {
				/* SUN.holesdata */
				if (value_length < sparse_map_limit) {
					p = __archive_read_ahead(a, value_length, &bytes_read);
					if (p == NULL) {
						archive_set_error(&a->archive, EINVAL,
								  "Truncated archive"
								  " detected while reading SUN.holesdata");
						return (ARCHIVE_FATAL);
					}
					err = pax_attribute_SUN_holesdata(a, tar, entry, p, value_length);
					if (err < ARCHIVE_OK) {
						archive_set_error(&a->archive,
								  ARCHIVE_ERRNO_MISC,
								  "Parse error: SUN.holesdata");
					}
				} else {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
							  "Unreasonably large sparse map: %d > %d",
							  (int)value_length, (int)sparse_map_limit);
					err = ARCHIVE_FAILED;
				}
				__archive_read_consume(a, value_length);
				return (err);
			}
		}
		break;
	case 'a':
		if (key_length == 5 && memcmp(key, "atime", 5) == 0) {
			if ((err = pax_attribute_read_time(a, value_length, &t, &n, unconsumed)) == ARCHIVE_OK) {
				archive_entry_set_atime(entry, t, n);
			}
			return (err);
		}
		break;
	case 'c':
		if (key_length == 5 && memcmp(key, "ctime", 5) == 0) {
			if ((err = pax_attribute_read_time(a, value_length, &t, &n, unconsumed)) == ARCHIVE_OK) {
				archive_entry_set_ctime(entry, t, n);
			}
			return (err);
		} else if (key_length == 7 && memcmp(key, "charset", 7) == 0) {
			/* TODO: Publish charset information in entry. */
		} else if (key_length == 7 && memcmp(key, "comment", 7) == 0) {
			/* TODO: Publish comment in entry. */
		}
		break;
	case 'g':
		if (key_length == 3 && memcmp(key, "gid", 3) == 0) {
			if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
				archive_entry_set_gid(entry, t);
			}
			return (err);
		} else if (key_length == 5 && memcmp(key, "gname", 5) == 0) {
			if (value_length > guname_limit) {
				*unconsumed += value_length;
				err = ARCHIVE_WARN;
			} else {
				err = read_bytes_to_string(a, &(tar->entry_gname), value_length, unconsumed);
			}
			return (err);
		}
		break;
	case 'h':
		if (key_length == 10 && memcmp(key, "hdrcharset", 10) == 0) {
			if (value_length < 64) {
				p = __archive_read_ahead(a, value_length, &bytes_read);
				if (p == NULL) {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
							  "Truncated tar archive "
							  "detected while reading hdrcharset attribute");
					return (ARCHIVE_FATAL);
				}
				if (value_length == 6
				    && memcmp(p, "BINARY", 6) == 0) {
					/* Binary  mode. */
					tar->pax_hdrcharset_utf8 = 0;
					err = ARCHIVE_OK;
				} else if (value_length == 23
					   && memcmp(p, "ISO-IR 10646 2000 UTF-8", 23) == 0) {
					tar->pax_hdrcharset_utf8 = 1;
					err = ARCHIVE_OK;
				} else {
					/* TODO: Unrecognized character set */
					err  = ARCHIVE_WARN;
				}
			} else {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
						  "hdrcharset attribute is unreasonably large (%d bytes)",
						  (int)value_length);
				err = ARCHIVE_WARN;
			}
			__archive_read_consume(a, value_length);
			return (err);
		}
		break;
	case 'l':
		/* pax interchange doesn't distinguish hardlink vs. symlink. */
		if (key_length == 8 && memcmp(key, "linkpath", 8) == 0) {
			if (value_length > pathname_limit) {
				*unconsumed += value_length;
				err = ARCHIVE_WARN;
			} else {
				err = read_bytes_to_string(a, &tar->entry_linkpath, value_length, unconsumed);
			}
			return (err);
		}
		break;
	case 'm':
		if (key_length == 5 && memcmp(key, "mtime", 5) == 0) {
			if ((err = pax_attribute_read_time(a, value_length, &t, &n, unconsumed)) == ARCHIVE_OK) {
				archive_entry_set_mtime(entry, t, n);
			}
			return (err);
		}
		break;
	case 'p':
		if (key_length == 4 && memcmp(key, "path", 4) == 0) {
			if (value_length > pathname_limit) {
				*unconsumed += value_length;
				err = ARCHIVE_WARN;
			} else {
				err = read_bytes_to_string(a, &(tar->entry_pathname), value_length, unconsumed);
			}
			return (err);
		}
		break;
	case 'r':
		/* POSIX has reserved 'realtime.*' */
		break;
	case 's':
		/* POSIX has reserved 'security.*' */
		/* Someday: if (strcmp(key, "security.acl") == 0) { ... } */
		if (key_length == 4 && memcmp(key, "size", 4) == 0) {
			/* "size" is the size of the data in the entry. */
			if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
				tar->pax_size = t;
				tar->size_fields |= TAR_SIZE_PAX_SIZE;
			}
			else if (t == INT64_MAX) {
				/* Note: pax_attr_read_number returns INT64_MAX on overflow or < 0 */
				tar->entry_bytes_remaining = 0;
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Tar size attribute overflow");
				return (ARCHIVE_FATAL);
			}
			return (err);
		}
		break;
	case 'u':
		if (key_length == 3 && memcmp(key, "uid", 3) == 0) {
			if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
				archive_entry_set_uid(entry, t);
			}
			return (err);
		} else if (key_length == 5 && memcmp(key, "uname", 5) == 0) {
			if (value_length > guname_limit) {
				*unconsumed += value_length;
				err = ARCHIVE_WARN;
			} else {
				err = read_bytes_to_string(a, &(tar->entry_uname), value_length, unconsumed);
			}
			return (err);
		}
		break;
	}

	/* Unrecognized key, just skip the entire value. */
	__archive_read_consume(a, value_length);
	return (err);
}